

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBInterpolater.cpp
# Opt level: O1

void __thiscall
amrex::EBCellConservativeLinear::interp
          (EBCellConservativeLinear *this,FArrayBox *crse,int crse_comp,FArrayBox *fine,
          int fine_comp,int ncomp,Box *fine_region,IntVect *ratio,Geometry *crse_geom,
          Geometry *fine_geom,Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcr,
          int actual_comp,int actual_state,RunOn runon)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  EBCellFlagFab *this_00;
  EBCellFlagFab *this_01;
  EBCellFlag *pEVar14;
  double *pdVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  undefined8 uVar19;
  FabType FVar20;
  FabType FVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  uint uVar28;
  int iVar29;
  int iVar30;
  long lVar31;
  uint uVar32;
  uint uVar33;
  long lVar34;
  uint uVar35;
  uint uVar36;
  long lVar37;
  double *pdVar38;
  uint uVar39;
  uint uVar40;
  long lVar41;
  bool bVar42;
  ulong uVar43;
  ulong uVar44;
  Box lhs;
  EBFArrayBox *crse_eb;
  Box local_188;
  ulong local_160;
  double *local_158;
  FArrayBox *local_150;
  int local_148;
  undefined4 uStack_144;
  int local_140;
  undefined4 uStack_13c;
  Box local_4c;
  
  _local_140 = CONCAT44(uStack_13c,crse_comp);
  _local_148 = CONCAT44(uStack_144,fine_comp);
  CellConservativeLinear::interp
            (&this->super_CellConservativeLinear,crse,crse_comp,fine,fine_comp,ncomp,fine_region,
             ratio,crse_geom,fine_geom,bcr,actual_comp,actual_state,runon);
  uVar27 = *(ulong *)(fine_region->smallend).vect;
  uVar18 = *(ulong *)(fine_region->bigend).vect;
  uVar19 = *(undefined8 *)((fine_region->bigend).vect + 2);
  local_188.smallend.vect[2] = (int)*(undefined8 *)((fine_region->smallend).vect + 2);
  uVar44 = *(ulong *)(fine->super_BaseFab<double>).domain.smallend.vect;
  uVar43 = CONCAT44(-(uint)((int)(uVar44 >> 0x20) < (int)(uVar27 >> 0x20)),
                    -(uint)((int)uVar44 < (int)uVar27));
  local_188.smallend.vect._0_8_ = ~uVar43 & uVar44 | uVar27 & uVar43;
  uVar28 = (fine->super_BaseFab<double>).domain.smallend.vect[2];
  if ((int)uVar28 < local_188.smallend.vect[2]) {
    uVar28 = local_188.smallend.vect[2];
  }
  uVar44 = *(ulong *)(fine->super_BaseFab<double>).domain.bigend.vect;
  uVar27 = CONCAT44(-(uint)((int)(uVar18 >> 0x20) < (int)(uVar44 >> 0x20)),
                    -(uint)((int)uVar18 < (int)uVar44));
  uVar44 = ~uVar27 & uVar44 | uVar18 & uVar27;
  local_188.bigend.vect[0] = (int)uVar44;
  local_188.bigend.vect[1] = (int)(uVar44 >> 0x20);
  local_188.bigend.vect[2] = (int)uVar19;
  iVar29 = (fine->super_BaseFab<double>).domain.bigend.vect[2];
  if (local_188.bigend.vect[2] < iVar29) {
    iVar29 = local_188.bigend.vect[2];
  }
  local_188.btype.itype = (uint)((ulong)uVar19 >> 0x20);
  local_188.bigend.vect[2] = iVar29;
  if (*(int *)&(crse->super_BaseFab<double>).field_0x44 != 0) {
    this_00 = (EBCellFlagFab *)crse[1].super_BaseFab<double>._vptr_BaseFab;
    this_01 = (EBCellFlagFab *)fine[1].super_BaseFab<double>._vptr_BaseFab;
    local_188.smallend.vect[2] = uVar28;
    local_150 = crse;
    (*(this->super_CellConservativeLinear).super_Interpolater.super_InterpBase._vptr_InterpBase[3])
              (&local_4c,this,&local_188,ratio);
    FVar20 = EBCellFlagFab::getType(this_01,&local_188);
    FVar21 = EBCellFlagFab::getType(this_00,&local_4c);
    if ((FVar20 == multivalued) || (FVar21 == multivalued)) {
      Abort_host("EBCellConservativeLinear::interp: multivalued not implemented");
    }
    else if ((FVar20 != covered) && (0 < ncomp)) {
      iVar29 = (fine->super_BaseFab<double>).domain.smallend.vect[0];
      iVar1 = (fine->super_BaseFab<double>).domain.smallend.vect[1];
      iVar2 = (fine->super_BaseFab<double>).domain.smallend.vect[2];
      lVar34 = (long)(((fine->super_BaseFab<double>).domain.bigend.vect[0] - iVar29) + 1);
      lVar37 = (long)(((fine->super_BaseFab<double>).domain.bigend.vect[1] - iVar1) + 1);
      uVar44 = (ulong)local_188.smallend.vect[0];
      lVar41 = lVar37 * lVar34 *
               (long)(((fine->super_BaseFab<double>).domain.bigend.vect[2] - iVar2) + 1);
      pEVar14 = (this_00->super_BaseFab<amrex::EBCellFlag>).dptr;
      iVar3 = (this_00->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[0];
      local_158 = (fine->super_BaseFab<double>).dptr +
                  ((local_148 * lVar41 + uVar44) - (long)iVar29);
      iVar29 = (this_00->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1];
      iVar4 = (this_00->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
      iVar5 = (this_00->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1];
      lVar25 = (long)(((this_00->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0] - iVar3) +
                     1);
      pdVar15 = (local_150->super_BaseFab<double>).dptr;
      iVar6 = (local_150->super_BaseFab<double>).domain.smallend.vect[0];
      iVar7 = (local_150->super_BaseFab<double>).domain.smallend.vect[1];
      iVar8 = (local_150->super_BaseFab<double>).domain.smallend.vect[2];
      iVar9 = (local_150->super_BaseFab<double>).domain.bigend.vect[2];
      lVar26 = (long)(((local_150->super_BaseFab<double>).domain.bigend.vect[0] - iVar6) + 1);
      lVar31 = (((local_150->super_BaseFab<double>).domain.bigend.vect[1] - iVar7) + 1) * lVar26;
      iVar10 = ratio->vect[0];
      iVar11 = ratio->vect[1];
      iVar12 = ratio->vect[2];
      local_160 = 0;
      do {
        if (local_188.smallend.vect[2] <= local_188.bigend.vect[2]) {
          uVar28 = local_188.smallend.vect[2];
          do {
            if (local_188.smallend.vect[1] <= local_188.bigend.vect[1]) {
              uVar32 = uVar28 + 1;
              uVar35 = -uVar32;
              if (0 < (int)uVar32) {
                uVar35 = uVar32;
              }
              uVar36 = ~(uVar35 >> 1);
              uVar32 = ~(uVar35 >> 2);
              if (-1 < (int)uVar28) {
                uVar36 = uVar28 >> 1;
                uVar32 = uVar28 >> 2;
              }
              uVar17 = local_188.smallend.vect[1];
              do {
                if (local_188.smallend.vect[0] <= local_188.bigend.vect[0]) {
                  pdVar38 = (double *)
                            ((((long)(int)uVar28 - (long)iVar2) * lVar37 * 8 + (long)iVar1 * -8 +
                             (long)(int)uVar17 * 8) * lVar34 + (long)local_158);
                  uVar33 = uVar17 + 1;
                  uVar16 = -uVar33;
                  if (0 < (int)uVar33) {
                    uVar16 = uVar33;
                  }
                  uVar33 = ~(uVar16 >> 2);
                  if (-1 < (int)uVar17) {
                    uVar33 = uVar17 >> 2;
                  }
                  uVar27 = uVar44;
                  uVar39 = ~(uVar16 >> 1);
                  if (-1 < (int)uVar17) {
                    uVar39 = uVar17 >> 1;
                  }
                  do {
                    uVar23 = (uint)uVar27;
                    if (iVar10 == 4) {
                      if ((long)uVar27 < 0) {
                        uVar23 = uVar23 + 1;
                        uVar40 = -uVar23;
                        if (0 < (int)uVar23) {
                          uVar40 = uVar23;
                        }
                        uVar23 = uVar40 >> 2;
LAB_006061d1:
                        uVar23 = ~uVar23;
                      }
                      else {
                        uVar23 = (uint)(uVar27 >> 2) & 0x3fffffff;
                      }
                    }
                    else if (iVar10 == 2) {
                      if ((long)uVar27 < 0) {
                        uVar23 = uVar23 + 1;
                        uVar40 = -uVar23;
                        if (0 < (int)uVar23) {
                          uVar40 = uVar23;
                        }
                        uVar23 = uVar40 >> 1;
                        goto LAB_006061d1;
                      }
                      uVar23 = (uint)(uVar27 >> 1) & 0x7fffffff;
                    }
                    else if (iVar10 != 1) {
                      if ((long)uVar27 < 0) {
                        iVar30 = uVar23 + 1;
                        iVar22 = -iVar30;
                        if (0 < iVar30) {
                          iVar22 = iVar30;
                        }
                        uVar23 = iVar22 / iVar10;
                        goto LAB_006061d1;
                      }
                      uVar23 = (uint)((long)((ulong)(uint)((int)uVar23 >> 0x1f) << 0x20 |
                                            uVar27 & 0xffffffff) / (long)iVar10);
                    }
                    uVar40 = uVar17;
                    if (((iVar11 != 1) && (uVar40 = uVar33, iVar11 != 4)) &&
                       (uVar40 = uVar39, iVar11 != 2)) {
                      if ((int)uVar17 < 0) {
                        uVar40 = ~((int)uVar16 / iVar11);
                      }
                      else {
                        uVar40 = (int)uVar17 / iVar11;
                      }
                    }
                    uVar24 = uVar28;
                    if (((iVar12 != 1) && (uVar24 = uVar32, iVar12 != 4)) &&
                       (uVar24 = uVar36, iVar12 != 2)) {
                      if ((int)uVar28 < 0) {
                        uVar24 = ~((int)uVar35 / iVar12);
                      }
                      else {
                        uVar24 = (int)uVar28 / iVar12;
                      }
                    }
                    uVar13 = pEVar14[(int)(uVar40 - iVar29) * lVar25 +
                                     (long)(int)(uVar23 - iVar3) +
                                     ((long)(int)uVar24 - (long)iVar4) *
                                     ((iVar5 - iVar29) + 1) * lVar25].flag;
                    if ((int)(((uVar13 >> 0xf & 1) - ((int)uVar13 >> 0x1f)) +
                              (uint)((uVar13 >> 0x10 & 1) != 0) + (uVar13 >> 0x11 & 1) +
                              (uint)((uVar13 >> 0x13 & 1) != 0) + (uVar13 >> 0x14 & 1) +
                              (uint)((uVar13 >> 0x15 & 1) != 0) + (uVar13 >> 0x16 & 1) +
                              (uint)((uVar13 >> 5 & 1) != 0) + (uVar13 >> 6 & 1) +
                              (uint)((uVar13 >> 7 & 1) != 0) + (uVar13 >> 8 & 1) +
                              (uint)((uVar13 >> 9 & 1) != 0) + (uVar13 >> 10 & 1) +
                              (uint)((uVar13 >> 0xb & 1) != 0) + (uVar13 >> 0xc & 1) +
                              (uint)((uVar13 >> 0xd & 1) != 0) + (uVar13 >> 0x17 & 1) +
                              (uint)((uVar13 >> 0x18 & 1) != 0) + (uVar13 >> 0x19 & 1) +
                              (uint)((uVar13 >> 0x1a & 1) != 0) + (uVar13 >> 0x1b & 1) +
                              (uint)((uVar13 >> 0x1c & 1) != 0) + (uVar13 >> 0x1d & 1) +
                              (uint)((uVar13 >> 0x1e & 1) != 0) + (uint)((uVar13 >> 0xe & 1) != 0) +
                             1) < 0x1b) {
                      *pdVar38 = pdVar15[(int)(uVar40 - iVar7) * lVar26 +
                                         (long)(int)(uVar23 - iVar6) +
                                         (int)(uVar24 - iVar8) * lVar31 +
                                         ((long)local_140 + local_160) *
                                         ((iVar9 - iVar8) + 1) * lVar31];
                    }
                    uVar27 = uVar27 + 1;
                    pdVar38 = pdVar38 + 1;
                  } while (local_188.bigend.vect[0] + 1 != (int)uVar27);
                }
                bVar42 = uVar17 != local_188.bigend.vect[1];
                uVar17 = uVar17 + 1;
              } while (bVar42);
            }
            bVar42 = uVar28 != local_188.bigend.vect[2];
            uVar28 = uVar28 + 1;
          } while (bVar42);
        }
        local_160 = local_160 + 1;
        local_158 = local_158 + lVar41;
      } while (local_160 != (uint)ncomp);
    }
  }
  return;
}

Assistant:

void
EBCellConservativeLinear::interp (const FArrayBox& crse,
                                  int              crse_comp,
                                  FArrayBox&       fine,
                                  int              fine_comp,
                                  int              ncomp,
                                  const Box&       fine_region,
                                  const IntVect&   ratio,
                                  const Geometry&  crse_geom,
                                  const Geometry&  fine_geom,
                                  Vector<BCRec> const&  bcr,
                                  int              actual_comp,
                                  int              actual_state,
                                  RunOn            runon)
{
    CellConservativeLinear::interp(crse, crse_comp, fine, fine_comp, ncomp, fine_region, ratio,
                                   crse_geom, fine_geom, bcr, actual_comp, actual_state, runon);

    const Box& target_fine_region = fine_region & fine.box();

    if (crse.getType() == FabType::regular)
    {
        BL_ASSERT(amrex::getEBCellFlagFab(fine).getType(target_fine_region) == FabType::regular);
    }
    else
    {
        const EBFArrayBox& crse_eb = static_cast<EBFArrayBox const&>(crse);
        EBFArrayBox&       fine_eb = static_cast<EBFArrayBox      &>(fine);

        const EBCellFlagFab& crse_flag = crse_eb.getEBCellFlagFab();
        const EBCellFlagFab& fine_flag = fine_eb.getEBCellFlagFab();

        const Box& crse_bx = CoarseBox(target_fine_region,ratio);

        const FabType ftype = fine_flag.getType(target_fine_region);
        const FabType ctype = crse_flag.getType(crse_bx);

        if (ftype == FabType::multivalued || ctype == FabType::multivalued)
        {
            amrex::Abort("EBCellConservativeLinear::interp: multivalued not implemented");
        }
        else if (ftype == FabType::covered)
        {
            ; // don't need to do anything special
        }
        else
        {
            const auto& cflag = crse_flag.const_array();
            auto const& fa = fine.array();
            auto const& ca = crse.const_array();
            AMREX_HOST_DEVICE_FOR_4D_FLAG(runon, target_fine_region, ncomp, i, j, k, n,
            {
                Dim3 cxyz = amrex::coarsen(Dim3{i,j,k}, ratio);
                if (cflag(cxyz.x,cxyz.y,cxyz.z).numNeighbors() < AMREX_D_TERM(3,*3,*3)) {
                    fa(i,j,k,n+fine_comp) = ca(cxyz.x,cxyz.y,cxyz.z,n+crse_comp);
                }
            });
        }
    }
}